

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodictable.hpp
# Opt level: O2

void __thiscall indigox::Element::~Element(Element *this)

{
  std::__cxx11::string::~string((string *)&this->symbol_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

inline Float GetAtomicMass() const { return mass_; }